

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

ActionResultHolder<bool> *
testing::internal::ActionResultHolder<bool>::
PerformAction<bool(n_e_s::core::INesController::Button)>
          (Action<bool_(n_e_s::core::INesController::Button)> *action,ArgumentTuple *args)

{
  Result RVar1;
  ActionResultHolder<bool> *pAVar2;
  _Head_base<0UL,_n_e_s::core::INesController::Button,_false> local_1c;
  
  pAVar2 = (ActionResultHolder<bool> *)operator_new(0x10);
  local_1c._M_head_impl =
       (args->super__Tuple_impl<0UL,_n_e_s::core::INesController::Button>).
       super__Head_base<0UL,_n_e_s::core::INesController::Button,_false>._M_head_impl;
  RVar1 = Action<bool_(n_e_s::core::INesController::Button)>::Perform
                    (action,(ArgumentTuple *)&local_1c);
  (pAVar2->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase =
       (_func_int **)&PTR__UntypedActionResultHolderBase_002adc18;
  (pAVar2->result_).value_ = RVar1;
  return pAVar2;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }